

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  string *psVar6;
  UnknownFieldSet *this_01;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  _func_int **pp_Var10;
  string serial;
  AggregateErrorCollector collector;
  Parser parser;
  AggregateOptionFinder finder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  ErrorCollector local_138;
  ulong *local_130;
  _func_int *local_128;
  ulong auStack_120 [2];
  string local_110;
  undefined1 local_f0 [56];
  Parser local_b8;
  Finder local_98;
  DescriptorBuilder *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [56];
  MessageLite *this_00;
  
  if (((this->uninterpreted_option_->_has_bits_).has_bits_[0] & 4) == 0) {
    std::operator+(&local_158,"Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
    plVar7 = plVar3 + 2;
    if ((ParseInfoTree **)*plVar3 == (ParseInfoTree **)plVar7) {
      local_b8.parse_info_tree_ = (ParseInfoTree *)*plVar7;
      local_b8._24_8_ = plVar3[3];
      local_b8.error_collector_ = (ErrorCollector *)&local_b8.parse_info_tree_;
    }
    else {
      local_b8.parse_info_tree_ = (ParseInfoTree *)*plVar7;
      local_b8.error_collector_ = (ErrorCollector *)*plVar3;
    }
    local_b8.finder_ = (Finder *)plVar3[1];
    *plVar3 = (long)plVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,**(ulong **)option_field);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar3[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_110._M_string_length = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    pp_Var10 = (_func_int **)(plVar3 + 2);
    if ((_func_int **)*plVar3 == pp_Var10) {
      local_128 = *pp_Var10;
      auStack_120[0] = plVar3[3];
      local_138._vptr_ErrorCollector = &local_128;
    }
    else {
      local_128 = *pp_Var10;
      local_138._vptr_ErrorCollector = (_func_int **)*plVar3;
    }
    local_130 = (ulong *)plVar3[1];
    *plVar3 = (long)pp_Var10;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_138,**(ulong **)option_field);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar9) {
      local_f0._16_8_ = *psVar9;
      local_f0._24_8_ = plVar3[3];
      local_f0._0_8_ = local_f0 + 0x10;
    }
    else {
      local_f0._16_8_ = *psVar9;
      local_f0._0_8_ = (size_type *)*plVar3;
    }
    local_f0._8_8_ = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_f0);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar9) {
      local_68._16_8_ = *psVar9;
      local_68._24_8_ = plVar3[3];
      local_68._0_8_ = local_68 + 0x10;
    }
    else {
      local_68._16_8_ = *psVar9;
      local_68._0_8_ = (size_type *)*plVar3;
    }
    local_68._8_8_ = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if (local_138._vptr_ErrorCollector != &local_128) {
      operator_delete(local_138._vptr_ErrorCollector,(ulong)(local_128 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if (local_b8.error_collector_ != (ErrorCollector *)&local_b8.parse_info_tree_) {
      operator_delete(local_b8.error_collector_,
                      (ulong)&((local_b8.parse_info_tree_)->locations_)._M_t._M_impl.field_0x1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
              (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
               option_field);
  }
  pMVar4 = DynamicMessageFactory::GetPrototype
                     (&this->dynamic_factory_,*(Descriptor **)(option_field + 0x70));
  iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])(pMVar4);
  this_00 = (MessageLite *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (MessageLite *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1995);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)local_68,"CHECK failed: dynamic.get() != NULL: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Could not create an instance of ");
    local_f0._0_8_ = local_f0._0_8_ & 0xffffffffff000000;
    FieldDescriptor::DebugStringWithOptions_abi_cxx11_
              (&local_110,option_field,(DebugStringOptions *)local_f0);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_110);
    internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (this_00 == (MessageLite *)0x0) {
    internal::LogMessage::~LogMessage((LogMessage *)local_68);
  }
  local_138._vptr_ErrorCollector = (_func_int **)&PTR__AggregateErrorCollector_0042b5f0;
  local_128 = (_func_int *)0x0;
  auStack_120[0] = auStack_120[0] & 0xffffffffffffff00;
  local_98._vptr_Finder = (_func_int **)&PTR__Finder_0042b638;
  local_90 = this->builder_;
  local_130 = auStack_120;
  TextFormat::Parser::Parser(&local_b8);
  local_b8.error_collector_ = &local_138;
  local_b8.finder_ = &local_98;
  bVar1 = TextFormat::Parser::ParseFromString
                    (&local_b8,(this->uninterpreted_option_->aggregate_value_).ptr_,
                     (Message *)this_00);
  if (bVar1) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    local_158._M_string_length = 0;
    local_158.field_2._M_allocated_capacity =
         local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (this_00 == (MessageLite *)0x0) {
      __assert_fail("ptr_ != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                    ,0x5f,
                    "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                   );
    }
    MessageLite::SerializeToString(this_00,&local_158);
    if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
      GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
                 option_field);
    }
    if (*(int *)(option_field + 0x48) == 0xb) {
      psVar6 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                         (unknown_fields,*(int *)(option_field + 0x38));
      std::__cxx11::string::_M_assign((string *)psVar6);
    }
    else {
      if (*(GoogleOnceDynamic **)(option_field + 0x40) != (GoogleOnceDynamic *)0x0) {
        GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                  (*(GoogleOnceDynamic **)(option_field + 0x40),FieldDescriptor::TypeOnceInit,
                   option_field);
      }
      if (*(int *)(option_field + 0x48) != 10) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_f0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x19a9);
        pLVar5 = internal::LogMessage::operator<<
                           ((LogMessage *)local_f0,
                            "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                           );
        internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)local_f0);
      }
      this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x38));
      UnknownFieldSet::ParseFromArray
                (this_01,local_158._M_dataplus._M_p,(int)local_158._M_string_length);
    }
    local_88.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    local_88._M_dataplus._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_002ef30e;
  }
  else {
    std::operator+(&local_88,"Error while parsing option value for \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    option_field);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
    puVar8 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158.field_2._8_8_ = plVar3[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *puVar8;
      local_158._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_158._M_string_length = plVar3[1];
    *plVar3 = (long)puVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_130);
    psVar9 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar9) {
      local_f0._16_8_ = *psVar9;
      local_f0._24_8_ = plVar3[3];
      local_f0._0_8_ = local_f0 + 0x10;
    }
    else {
      local_f0._16_8_ = *psVar9;
      local_f0._0_8_ = (size_type *)*plVar3;
    }
    local_f0._8_8_ = plVar3[1];
    *plVar3 = (long)psVar9;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_f0);
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) goto LAB_002ef30e;
  }
  operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
LAB_002ef30e:
  TextFormat::Parser::~Parser(&local_b8);
  TextFormat::Finder::~Finder(&local_98);
  local_138._vptr_ErrorCollector = (_func_int **)&PTR__AggregateErrorCollector_0042b5f0;
  if (local_130 != auStack_120) {
    operator_delete(local_130,auStack_120[0] + 1);
  }
  io::ErrorCollector::~ErrorCollector(&local_138);
  if (this_00 != (MessageLite *)0x0) {
    (*this_00->_vptr_MessageLite[1])(this_00);
  }
  return bVar1;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" + option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" + option_field->name() +
                         ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  google::protobuf::scoped_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != NULL)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(),  FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}